

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O1

void __thiscall
iDynTree::XMLParser::setDocumentFactory
          (XMLParser *this,
          function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *factory)

{
  function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *this_00;
  _Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false> _Var1;
  _func_shared_ptr<iDynTree::XMLDocument>__Any_data_ptr_XMLParserState_ptr *__tmp_1;
  undefined8 local_28;
  undefined8 uStack_20;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  _Var1._M_head_impl =
       (this->m_pimpl)._M_t.
       super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
       .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl;
  this_00 = &(_Var1._M_head_impl)->f_documentFactory;
  if ((factory->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>::operator=
              (this_00,factory);
    return;
  }
  local_28 = *(undefined8 *)&(this_00->super__Function_base)._M_functor;
  uStack_20 = *(undefined8 *)((long)&(_Var1._M_head_impl)->f_documentFactory + 8);
  *(undefined8 *)&(this_00->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(_Var1._M_head_impl)->f_documentFactory + 8) = 0;
  local_18 = *(_Manager_type *)((long)&(_Var1._M_head_impl)->f_documentFactory + 0x10);
  *(code **)((long)&(_Var1._M_head_impl)->f_documentFactory + 0x10) =
       std::
       _Function_handler<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/xml/src/XMLParser.cpp:318:42)>
       ::_M_manager;
  local_10 = *(_Invoker_type *)((long)&(_Var1._M_head_impl)->f_documentFactory + 0x18);
  *(code **)((long)&(_Var1._M_head_impl)->f_documentFactory + 0x18) =
       std::
       _Function_handler<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/xml/src/XMLParser.cpp:318:42)>
       ::_M_invoke;
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)((_Any_data *)&local_28,(_Any_data *)&local_28,3);
  }
  return;
}

Assistant:

void XMLParser::setDocumentFactory(std::function<std::shared_ptr<XMLDocument>(XMLParserState& state)> factory)
    {
        assert(m_pimpl);
        if (factory) {
            m_pimpl->f_documentFactory = factory;
        } else {
            // Restore the default function
            m_pimpl->f_documentFactory = [](XMLParserState& state){ return std::shared_ptr<XMLDocument>(new XMLDocument(state)); };
        }
    }